

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dll.c
# Opt level: O2

nsync_dll_list_ nsync::nsync_dll_make_last_in_list_(nsync_dll_list_ list,nsync_dll_element_ *e)

{
  if (e != (nsync_dll_element_ *)0x0) {
    nsync_dll_make_first_in_list_(list,e->next);
    list = e;
  }
  return list;
}

Assistant:

nsync_dll_list_ nsync_dll_make_last_in_list_ (nsync_dll_list_ list, nsync_dll_element_ *e) {
	if (e != NULL) {
		nsync_dll_make_first_in_list_ (list, e->next);
		list = e;
	}
	return (list);
}